

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrit.cc
# Opt level: O3

DCSFileNameHeader *
lrit::getHeader<lrit::DCSFileNameHeader>
          (DCSFileNameHeader *__return_storage_ptr__,Buffer *b,int pos)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer puVar2;
  undefined4 uVar3;
  ushort uVar4;
  HeaderReader<lrit::DCSFileNameHeader> r;
  HeaderReader<lrit::DCSFileNameHeader> local_58;
  size_t __nbytes;
  
  paVar1 = &local_58.h_.fileName.field_2;
  local_58.h_.fileName._M_string_length = 0;
  local_58.h_.fileName.field_2._M_local_buf[0] = '\0';
  puVar2 = (b->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_58.h_.headerType = puVar2[pos];
  uVar4 = *(ushort *)(puVar2 + (pos + 1));
  uVar4 = uVar4 << 8 | uVar4 >> 8;
  __nbytes = (size_t)uVar4;
  local_58.h_.headerLength = uVar4;
  uVar3 = local_58.h_._0_4_;
  local_58.p_ = pos + 3;
  __return_storage_ptr__->headerType = local_58.h_.headerType;
  __return_storage_ptr__->field_0x1 = local_58.h_._1_1_;
  __return_storage_ptr__->headerLength = uVar4;
  (__return_storage_ptr__->fileName)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->fileName).field_2;
  local_58.b_ = b;
  local_58.h_._0_4_ = uVar3;
  local_58.h_.fileName._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->fileName,paVar1,paVar1);
  HeaderReader<lrit::DCSFileNameHeader>::read
            (&local_58,(int)&__return_storage_ptr__->fileName,
             (void *)((ulong)__return_storage_ptr__->headerLength - 3),__nbytes);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.h_.fileName._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.h_.fileName._M_dataplus._M_p,
                    CONCAT71(local_58.h_.fileName.field_2._M_allocated_capacity._1_7_,
                             local_58.h_.fileName.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

DCSFileNameHeader getHeader(const Buffer& b, int pos) {
  auto r = HeaderReader<DCSFileNameHeader>(b, pos);
  auto h = r.getHeader();
  r.read(h.fileName, h.headerLength - 3);
  return h;
}